

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O0

int If_LogCreateAndXor(Vec_Int_t *vAig,int iLit0,int iLit1,int nSuppAll,int fXor)

{
  undefined4 local_24;
  int fXor_local;
  int nSuppAll_local;
  int iLit1_local;
  int iLit0_local;
  Vec_Int_t *vAig_local;
  
  if (fXor == 0) {
    local_24 = If_LogCreateAnd(vAig,iLit0,iLit1,nSuppAll);
  }
  else {
    local_24 = If_LogCreateXor(vAig,iLit0,iLit1,nSuppAll);
  }
  return local_24;
}

Assistant:

static inline int If_LogCreateAndXor( Vec_Int_t * vAig, int iLit0, int iLit1, int nSuppAll, int fXor )
{
    return fXor ? If_LogCreateXor(vAig, iLit0, iLit1, nSuppAll) : If_LogCreateAnd(vAig, iLit0, iLit1, nSuppAll);
}